

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::MultisampleRenderer::~MultisampleRenderer(MultisampleRenderer *this)

{
  MultisampleRenderer *this_local;
  
  this->_vptr_MultisampleRenderer = (_func_int **)&PTR__MultisampleRenderer_016a4ad8;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&this->m_fence);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&this->m_cmdBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&this->m_cmdPool);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&this->m_graphicsPipelines);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&this->m_pipelineLayout);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            (&this->m_vertexBufferAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&this->m_vertexBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&this->m_fragmentShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&this->m_vertexShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&this->m_framebuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            (&this->m_depthStencilAttachmentView);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            (&this->m_depthStencilImageAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&this->m_depthStencilImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&this->m_resolveAttachmentView);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            (&this->m_resolveImageAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&this->m_resolveImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&this->m_colorAttachmentView);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            (&this->m_colorImageAlloc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&this->m_colorImage);
  return;
}

Assistant:

MultisampleRenderer::~MultisampleRenderer (void)
{
}